

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O2

void __thiscall
DIntermissionScreen::Init(DIntermissionScreen *this,FIntermissionAction *desc,bool first)

{
  TArray<FIIntermissionPatch,_FIIntermissionPatch> *this_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  FIntermissionPatch *pFVar3;
  FIIntermissionPatch *pFVar4;
  undefined8 uVar5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  FTextureID FVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  char *name;
  FName *pFVar13;
  undefined4 extraout_var;
  NameEntry *pNVar14;
  byte *pbVar15;
  long lVar16;
  FString musicname;
  uint i;
  long lVar17;
  char *pp;
  FSoundID local_34;
  
  if ((desc->mCdTrack == 0) || (bVar6 = S_ChangeCDMusic(desc->mCdTrack,desc->mCdId,true), !bVar6)) {
    musicname.Chars = (desc->mMusic).Chars;
    if (*(int *)(musicname.Chars + -0xc) == 0) {
      musicname.Chars = gameinfo.finaleMusic.Chars;
      iVar10 = gameinfo.finaleOrder;
      if (!first) goto LAB_0032612c;
    }
    else {
      iVar10 = desc->mMusicOrder;
    }
    S_ChangeMusic(musicname.Chars,iVar10,desc->mMusicLooping,false);
  }
LAB_0032612c:
  *(int *)&(this->super_DObject).field_0x24 = desc->mDuration;
  name = (desc->mBackground).Chars;
  cVar7 = *name;
  if (cVar7 == '$') {
    name = FStringTable::operator()(&GStrings,name + 1);
  }
  else {
    if (cVar7 != '@') goto LAB_003261ba;
    uVar12 = strtoul(name + 1,&pp,10);
    if ((*pp == '\0') && (uVar8 = (int)uVar12 - 1, uVar8 < gameinfo.finalePages.Count)) {
      pFVar13 = gameinfo.finalePages.Array + uVar8;
LAB_003261a3:
      pNVar14 = FName::NameData.NameArray + pFVar13->Index;
    }
    else {
      pFVar13 = gameinfo.finalePages.Array;
      if (gameinfo.finalePages.Count != 0) goto LAB_003261a3;
      pNVar14 = (NameEntry *)&gameinfo.TitlePage;
    }
    name = pNVar14->Text;
  }
  cVar7 = *name;
LAB_003261ba:
  if (cVar7 != '\0') {
    FVar9 = FTextureManager::CheckForTexture(&TexMan,name,8,1);
    (this->mBackground).texnum = FVar9.texnum;
    this->mFlatfill = desc->mFlatfill;
  }
  local_34.ID = S_FindSound((desc->mSound).Chars);
  S_Sound(0x22,&stack0xffffffffffffffcc,1.0,0.0);
  if ((*(int *)((desc->mPalette).Chars + -0xc) != 0) &&
     (iVar10 = FWadCollection::CheckNumForFullName(&Wads,&desc->mPalette,true,0), 0 < iVar10)) {
    FMemLump::FMemLump((FMemLump *)&pp);
    FWadCollection::ReadLump((FWadCollection *)&stack0xffffffffffffffc0,0x1c6a4b0);
    FMemLump::operator=((FMemLump *)&pp,(FMemLump *)&stack0xffffffffffffffc0);
    FMemLump::~FMemLump((FMemLump *)&stack0xffffffffffffffc0);
    iVar10 = *(int *)(pp + -0xc);
    iVar11 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1a])();
    pbVar15 = (byte *)0x0;
    if (iVar10 == 0) {
      pp = (char *)pbVar15;
    }
    for (; (int)pbVar15 != 0x100; pbVar15 = pbVar15 + 1) {
      *(uint *)(CONCAT44(extraout_var,iVar11) + (long)pbVar15 * 4) =
           (uint)((byte *)pp)[1] << 8 | (uint)(byte)*pp << 0x10 | (uint)((byte *)pp)[2];
      pp = (char *)((byte *)pp + 3);
    }
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1c])();
    this->mPaletteChanged = true;
    NoWipe = 1;
    M_EnableMenu(false);
    FMemLump::~FMemLump((FMemLump *)&pp);
  }
  this_00 = &this->mOverlays;
  TArray<FIIntermissionPatch,_FIIntermissionPatch>::Resize(this_00,(desc->mOverlays).Count);
  lVar16 = 0x10;
  lVar17 = 0;
  for (uVar12 = 0; uVar12 < (this->mOverlays).Count; uVar12 = uVar12 + 1) {
    pFVar3 = (desc->mOverlays).Array;
    pFVar4 = this_00->Array;
    puVar1 = (undefined8 *)((long)&(pFVar3->mCondition).Index + lVar16);
    uVar5 = puVar1[1];
    puVar2 = (undefined8 *)((long)&pFVar4->x + lVar17);
    *puVar2 = *puVar1;
    puVar2[1] = uVar5;
    *(undefined4 *)((long)&(pFVar4->mCondition).Index + lVar17) =
         *(undefined4 *)((long)pFVar3 + lVar16 + -0x10);
    FVar9 = FTextureManager::CheckForTexture(&TexMan,*(char **)((long)pFVar3 + lVar16 + -8),8,1);
    *(int *)((long)&(this_00->Array->mPic).texnum + lVar17) = FVar9.texnum;
    lVar16 = lVar16 + 0x20;
    lVar17 = lVar17 + 0x18;
  }
  this->mTicker = 0;
  return;
}

Assistant:

void DIntermissionScreen::Init(FIntermissionAction *desc, bool first)
{
	int lumpnum;

	if (desc->mCdTrack == 0 || !S_ChangeCDMusic (desc->mCdTrack, desc->mCdId))
	{
		if (desc->mMusic.IsEmpty())
		{
			// only start the default music if this is the first action in an intermission
			if (first) S_ChangeMusic (gameinfo.finaleMusic, gameinfo.finaleOrder, desc->mMusicLooping);
		}
		else
		{
			S_ChangeMusic (desc->mMusic, desc->mMusicOrder, desc->mMusicLooping);
		}
	}
	mDuration = desc->mDuration;

	const char *texname = desc->mBackground;
	if (*texname == '@')
	{
		char *pp;
		unsigned int v = strtoul(texname+1, &pp, 10) - 1;
		if (*pp == 0 && v < gameinfo.finalePages.Size())
		{
			texname = gameinfo.finalePages[v].GetChars();
		}
		else if (gameinfo.finalePages.Size() > 0)
		{
			texname = gameinfo.finalePages[0].GetChars();
		}
		else
		{
			texname = gameinfo.TitlePage.GetChars();
		}
	}
	else if (*texname == '$')
	{
		texname = GStrings(texname+1);
	}
	if (texname[0] != 0)
	{
		mBackground = TexMan.CheckForTexture(texname, FTexture::TEX_MiscPatch);
		mFlatfill = desc->mFlatfill;
	}
	S_Sound (CHAN_VOICE | CHAN_UI, desc->mSound, 1.0f, ATTN_NONE);
	if (desc->mPalette.IsNotEmpty() && (lumpnum = Wads.CheckNumForFullName(desc->mPalette, true)) > 0)
	{
		PalEntry *palette;
		const BYTE *orgpal;
		FMemLump lump;
		int i;

		lump = Wads.ReadLump (lumpnum);
		orgpal = (BYTE *)lump.GetMem();
		palette = screen->GetPalette ();
		for (i = 256; i > 0; i--, orgpal += 3)
		{
			*palette++ = PalEntry (orgpal[0], orgpal[1], orgpal[2]);
		}
		screen->UpdatePalette ();
		mPaletteChanged = true;
		NoWipe = 1;
		M_EnableMenu(false);
	}
	mOverlays.Resize(desc->mOverlays.Size());
	for (unsigned i=0; i < mOverlays.Size(); i++)
	{
		mOverlays[i].x = desc->mOverlays[i].x;
		mOverlays[i].y = desc->mOverlays[i].y;
		mOverlays[i].mCondition = desc->mOverlays[i].mCondition;
		mOverlays[i].mPic = TexMan.CheckForTexture(desc->mOverlays[i].mName, FTexture::TEX_MiscPatch);
	}
	mTicker = 0;
}